

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.c
# Opt level: O3

void limit_scaling(c_float *D,c_int n)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  
  if (0 < n) {
    lVar2 = 0;
    do {
      uVar3 = -(ulong)(D[lVar2] < 0.0001);
      dVar1 = (double)(uVar3 & 0x3ff0000000000000 | ~uVar3 & (ulong)D[lVar2]);
      dVar4 = 10000.0;
      if (dVar1 <= 10000.0) {
        dVar4 = dVar1;
      }
      D[lVar2] = dVar4;
      lVar2 = lVar2 + 1;
    } while (n != lVar2);
  }
  return;
}

Assistant:

void limit_scaling(c_float *D, c_int n) {
  c_int i;

  for (i = 0; i < n; i++) {
    D[i] = D[i] < MIN_SCALING ? 1.0 : D[i];
    D[i] = D[i] > MAX_SCALING ? MAX_SCALING : D[i];
  }
}